

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O0

void __thiscall QPageRanges::addRange(QPageRanges *this,int from,int to)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  rvalue_ref in_RDI;
  long in_FS_OFFSET;
  rvalue_ref this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QMessageLogger *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI < 1) || (in_EDX < 1)) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (int)((ulong)in_RDI >> 0x20),(char *)in_RDI);
    QMessageLogger::warning
              (&stack0xffffffffffffffd0,
               "QPageRanges::addRange: \'from\' and \'to\' must be greater than 0");
  }
  else {
    this_00 = in_RDI;
    if (in_EDX < in_ESI) {
      std::swap<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
    }
    detach((QPageRanges *)this_00);
    QExplicitlySharedDataPointer<QPageRangesPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageRangesPrivate> *)0x548fcd);
    QList<QPageRanges::Range>::append((QList<QPageRanges::Range> *)this_00,in_RDI);
    QExplicitlySharedDataPointer<QPageRangesPrivate>::operator->
              ((QExplicitlySharedDataPointer<QPageRangesPrivate> *)0x548ff7);
    QPageRangesPrivate::mergeIntervals((QPageRangesPrivate *)CONCAT44(in_ESI,in_EDX));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageRanges::addRange(int from, int to)
{
    if (from <= 0 || to <= 0) {
        qWarning("QPageRanges::addRange: 'from' and 'to' must be greater than 0");
        return;
    }
    if (to < from)
        std::swap(from, to);

    detach();
    d->intervals.append({from, to});
    d->mergeIntervals();
}